

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Cone(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Vec_Ptr_t *pVVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined8 uVar6;
  undefined4 extraout_var_00;
  Gia_Man_t *pGVar7;
  char *pcVar8;
  Vec_Int_t *pVVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  char *pcVar13;
  long lVar14;
  char Buffer [1000];
  uint local_444;
  uint local_440;
  uint local_43c;
  uint local_438;
  undefined8 local_430;
  undefined8 local_428;
  char local_418 [1000];
  undefined4 extraout_var;
  
  local_43c = 0;
  Extra_UtilGetoptReset();
  local_430 = 1;
  local_444 = 0xffffffff;
  local_440 = 0;
  bVar3 = false;
  bVar2 = false;
  local_438 = 0;
  local_428 = 0xffffffff;
LAB_0028a6f1:
  while (iVar4 = Extra_UtilGetopt(argc,argv,"ORPLWaevh"), iVar11 = globalUtilOptind, 0x60 < iVar4) {
    if (iVar4 == 0x61) {
      bVar3 = (bool)(bVar3 ^ 1);
    }
    else if (iVar4 == 0x65) {
      bVar2 = (bool)(bVar2 ^ 1);
    }
    else {
      if (iVar4 != 0x76) goto switchD_0028a717_caseD_4d;
      local_438 = local_438 ^ 1;
    }
  }
  switch(iVar4) {
  case 0x4c:
    if (argc <= globalUtilOptind) {
      pcVar8 = "Command line switch \"-L\" should be followed by an integer.\n";
      break;
    }
    local_43c = atoi(argv[globalUtilOptind]);
    uVar5 = local_43c;
joined_r0x0028a7ff:
    globalUtilOptind = iVar11 + 1;
    if ((int)uVar5 < 0) {
switchD_0028a717_caseD_4d:
      Abc_Print(-2,"usage: &cone [-ORPLW num] [-aevh]\n");
      Abc_Print(-2,"\t         extracting multi-output sequential logic cones\n");
      Abc_Print(-2,"\t-O num : the index of first PO to extract [default = %d]\n",local_428);
      Abc_Print(-2,"\t-R num : (optional) the number of outputs to extract [default = %d]\n",
                local_430);
      Abc_Print(-2,"\t-P num : (optional) the partition number to extract [default = %d]\n",
                (ulong)local_444);
      Abc_Print(-2,"\t-L num : (optional) extract cones with higher level [default = %d]\n",
                (ulong)local_43c);
      Abc_Print(-2,"\t-W num : (optional) extract cones falling into this window [default = %d]\n",
                (ulong)local_440);
      pcVar8 = "all";
      if (!bVar3) {
        pcVar8 = "structural";
      }
      Abc_Print(-2,"\t-a     : toggle keeping all CIs or structral support only [default = %s]\n",
                pcVar8);
      pcVar13 = "yes";
      pcVar8 = "yes";
      if (!bVar2) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-e     : toggle writing all outputs into individual files [default = %s]\n",
                pcVar8);
      if (local_438 == 0) {
        pcVar13 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar13);
      pcVar8 = "\t-h     : print the command usage\n";
      iVar11 = -2;
LAB_0028aa9a:
      Abc_Print(iVar11,pcVar8);
      return 1;
    }
    goto LAB_0028a6f1;
  case 0x4d:
  case 0x4e:
  case 0x51:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
    goto switchD_0028a717_caseD_4d;
  case 0x4f:
    if (globalUtilOptind < argc) {
      iVar4 = atoi(argv[globalUtilOptind]);
      uVar6 = CONCAT44(extraout_var,iVar4);
      local_428 = uVar6;
LAB_0028a7fd:
      uVar5 = (uint)uVar6;
      goto joined_r0x0028a7ff;
    }
    pcVar8 = "Command line switch \"-O\" should be followed by an integer.\n";
    break;
  case 0x50:
    if (globalUtilOptind < argc) {
      local_444 = atoi(argv[globalUtilOptind]);
      uVar5 = local_444;
      goto joined_r0x0028a7ff;
    }
    pcVar8 = "Command line switch \"-P\" should be followed by an integer.\n";
    break;
  case 0x52:
    if (globalUtilOptind < argc) {
      iVar4 = atoi(argv[globalUtilOptind]);
      uVar6 = CONCAT44(extraout_var_00,iVar4);
      local_430 = uVar6;
      goto LAB_0028a7fd;
    }
    pcVar8 = "Command line switch \"-R\" should be followed by an integer.\n";
    break;
  case 0x57:
    if (globalUtilOptind < argc) {
      local_440 = atoi(argv[globalUtilOptind]);
      uVar5 = local_440;
      goto joined_r0x0028a7ff;
    }
    pcVar8 = "Command line switch \"-W\" should be followed by an integer.\n";
    break;
  default:
    if (iVar4 != -1) goto switchD_0028a717_caseD_4d;
    pGVar7 = pAbc->pGia;
    if (pGVar7 == (Gia_Man_t *)0x0) {
      pcVar8 = "Abc_CommandAbc9Cone(): There is no AIG.\n";
    }
    else {
      if (bVar2) {
        pVVar9 = pGVar7->vCos;
        uVar5 = pVVar9->nSize;
        uVar10 = (ulong)uVar5;
        uVar12 = uVar5 - pGVar7->nRegs;
        if (1 < uVar12) {
          uVar12 = uVar12 - 1;
          do {
            bVar2 = 9 < uVar12;
            uVar12 = uVar12 / 10;
          } while (bVar2);
        }
        if (pGVar7->nRegs < (int)uVar5) {
          lVar14 = 0;
          do {
            if ((int)uVar10 <= lVar14) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar11 = pVVar9->pArray[lVar14];
            if (((long)iVar11 < 0) || (pGVar7->nObjs <= iVar11)) {
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            if (pGVar7->pObjs == (Gia_Obj_t *)0x0) break;
            pGVar7 = Gia_ManDupDfsCone(pGVar7,pGVar7->pObjs + iVar11);
            pcVar8 = Extra_FileNameGeneric(pAbc->pGia->pSpec);
            sprintf(local_418,"%s_%0*d.aig",pcVar8);
            Gia_AigerWrite(pGVar7,local_418,0,0,0);
            Gia_ManStop(pGVar7);
            lVar14 = lVar14 + 1;
            pGVar7 = pAbc->pGia;
            pVVar9 = pGVar7->vCos;
            uVar10 = (ulong)pVVar9->nSize;
          } while (lVar14 < (long)(uVar10 - (long)pGVar7->nRegs));
        }
        puts("Dumped all outputs into individual AIGER files.");
        return 0;
      }
      if (local_43c == 0 && local_440 == 0) {
        if ((int)local_444 < 0) {
          iVar11 = (int)local_428;
          if ((-1 < iVar11) &&
             (iVar4 = (int)local_430, iVar4 + iVar11 <= pGVar7->vCos->nSize - pGVar7->nRegs)) {
            pVVar9 = Vec_IntStartRange(iVar11,iVar4);
            pGVar7 = Gia_ManDupCones(pAbc->pGia,pVVar9->pArray,iVar4,(uint)!bVar3);
            Vec_IntFree(pVVar9);
joined_r0x0028abd6:
            if (pGVar7 != (Gia_Man_t *)0x0) {
              Abc_FrameUpdateGia(pAbc,pGVar7);
              return 0;
            }
            return 0;
          }
          pcVar8 = "Abc_CommandAbc9Cone(): Range of outputs to extract is incorrect.\n";
        }
        else {
          pVVar1 = pAbc->vPoEquivs;
          if (pVVar1 == (Vec_Ptr_t *)0x0) {
            pcVar8 = "Abc_CommandAbc9Cone(): Partitions are not defined.\n";
          }
          else {
            if ((int)local_444 < pVVar1->nSize) {
              pGVar7 = Gia_ManDupCones(pGVar7,*(int **)((long)pVVar1->pArray[local_444] + 8),
                                       *(int *)((long)pVVar1->pArray[local_444] + 4),(uint)!bVar3);
              goto joined_r0x0028abd6;
            }
            pcVar8 = "Abc_CommandAbc9Cone(): Partition index exceed the array size.\n";
          }
        }
      }
      else {
        if ((local_43c == 0) || (local_440 == 0)) {
          pGVar7 = Gia_ManExtractWindow(pGVar7,local_43c,local_440,local_438);
          Abc_FrameUpdateGia(pAbc,pGVar7);
          return 0;
        }
        pcVar8 = 
        "Abc_CommandAbc9Cone(): Parameters -L (max level) and -W (timing window) cannot be specified at the same time.\n"
        ;
      }
    }
    iVar11 = -1;
    goto LAB_0028aa9a;
  }
  Abc_Print(-1,pcVar8);
  goto switchD_0028a717_caseD_4d;
}

Assistant:

int Abc_CommandAbc9Cone( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    Vec_Int_t * vPos;
    int c, iOutNum = -1, nOutRange = 1, iPartNum = -1, nLevelMax = 0, nTimeWindow = 0, fUseAllCis = 0, fExtractAll = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ORPLWaevh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'O':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-O\" should be followed by an integer.\n" );
                goto usage;
            }
            iOutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iOutNum < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            nOutRange = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nOutRange < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            iPartNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iPartNum < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nLevelMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLevelMax < 0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            nTimeWindow = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nTimeWindow < 0 )
                goto usage;
            break;
        case 'a':
            fUseAllCis ^= 1;
            break;
        case 'e':
            fExtractAll ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Cone(): There is no AIG.\n" );
        return 1;
    }
    if ( fExtractAll )
    {
        char Buffer[1000];
        Gia_Obj_t * pObj;
        int i, nDigits = Abc_Base10Log(Gia_ManPoNum(pAbc->pGia));
        Gia_ManForEachPo( pAbc->pGia, pObj, i )
        {
            Gia_Man_t * pOne = Gia_ManDupDfsCone( pAbc->pGia, pObj );
            sprintf( Buffer, "%s_%0*d.aig", Extra_FileNameGeneric(pAbc->pGia->pSpec), nDigits, i );
            Gia_AigerWrite( pOne, Buffer, 0, 0, 0 );
            Gia_ManStop( pOne );
        }
        printf( "Dumped all outputs into individual AIGER files.\n" );
        return 0;
    }
    if ( nLevelMax || nTimeWindow )
    {
        if ( nLevelMax && nTimeWindow )
        {
            Abc_Print( -1, "Abc_CommandAbc9Cone(): Parameters -L (max level) and -W (timing window) cannot be specified at the same time.\n" );
            return 1;
        }
        else
        {
            pTemp = Gia_ManExtractWindow( pAbc->pGia, nLevelMax, nTimeWindow, fVerbose );
            Abc_FrameUpdateGia( pAbc, pTemp );
            return 0;
        }
    }
    if ( iPartNum >= 0 )
    {
        Vec_Int_t * vClass;
        Vec_Vec_t * vClasses = (Vec_Vec_t *)pAbc->vPoEquivs;
        if ( vClasses == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9Cone(): Partitions are not defined.\n" );
            return 1;
        }
        if ( iPartNum >= Vec_VecSize(vClasses) )
        {
            Abc_Print( -1, "Abc_CommandAbc9Cone(): Partition index exceed the array size.\n" );
            return 1;
        }
        vClass = Vec_VecEntryInt( vClasses, iPartNum );
        pTemp = Gia_ManDupCones( pAbc->pGia, Vec_IntArray(vClass), Vec_IntSize(vClass), !fUseAllCis );
        if ( pTemp )
            Abc_FrameUpdateGia( pAbc, pTemp );
        return 0;
    }
    if ( iOutNum < 0 || iOutNum + nOutRange > Gia_ManPoNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Cone(): Range of outputs to extract is incorrect.\n" );
        return 1;
    }
    vPos = Vec_IntStartRange( iOutNum, nOutRange );
    pTemp = Gia_ManDupCones( pAbc->pGia, Vec_IntArray(vPos), nOutRange, !fUseAllCis );
    Vec_IntFree( vPos );
    if ( pTemp )
        Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &cone [-ORPLW num] [-aevh]\n" );
    Abc_Print( -2, "\t         extracting multi-output sequential logic cones\n" );
    Abc_Print( -2, "\t-O num : the index of first PO to extract [default = %d]\n", iOutNum );
    Abc_Print( -2, "\t-R num : (optional) the number of outputs to extract [default = %d]\n", nOutRange );
    Abc_Print( -2, "\t-P num : (optional) the partition number to extract [default = %d]\n", iPartNum );
    Abc_Print( -2, "\t-L num : (optional) extract cones with higher level [default = %d]\n", nLevelMax );
    Abc_Print( -2, "\t-W num : (optional) extract cones falling into this window [default = %d]\n", nTimeWindow );
    Abc_Print( -2, "\t-a     : toggle keeping all CIs or structral support only [default = %s]\n", fUseAllCis? "all": "structural" );
    Abc_Print( -2, "\t-e     : toggle writing all outputs into individual files [default = %s]\n", fExtractAll? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}